

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitArrayLen(InternalAnalyzer *this,ArrayLen *curr)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = wasm::Type::isNull(&curr->ref->type);
  if (bVar2) {
    this->parent->trap = true;
  }
  else {
    uVar1 = (curr->ref->type).id;
    if (((uint)uVar1 & 3) == 2 && 6 < uVar1) {
      this->parent->implicitTrap = true;
    }
  }
  return;
}

Assistant:

void visitArrayLen(ArrayLen* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      // traps when the arg is null
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
    }